

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O2

ZyanStatus ZyanVectorSwapElements(ZyanVector *vector,ZyanUSize index_first,ZyanUSize index_second)

{
  ulong uVar1;
  size_t __n;
  ZyanStatus ZVar2;
  void *pvVar3;
  void *__src;
  void *__dest;
  
  if (vector == (ZyanVector *)0x0) {
    ZVar2 = 0x80100004;
  }
  else {
    uVar1 = vector->size;
    ZVar2 = 0x80100008;
    if ((index_second < uVar1 && index_first < uVar1) &&
       (ZVar2 = 0x80100009, uVar1 != vector->capacity)) {
      __n = vector->element_size;
      if (__n == 0) {
        __assert_fail("vector->element_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                      ,0x227,"ZyanStatus ZyanVectorSwapElements(ZyanVector *, ZyanUSize, ZyanUSize)"
                     );
      }
      pvVar3 = vector->data;
      if (pvVar3 == (void *)0x0) {
        __assert_fail("vector->data",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                      ,0x228,"ZyanStatus ZyanVectorSwapElements(ZyanVector *, ZyanUSize, ZyanUSize)"
                     );
      }
      __dest = (void *)(uVar1 * __n + (long)pvVar3);
      __src = (void *)(index_first * __n + (long)pvVar3);
      pvVar3 = (void *)(index_second * __n + (long)pvVar3);
      memcpy(__dest,__src,__n);
      memcpy(__src,pvVar3,vector->element_size);
      memcpy(pvVar3,__dest,vector->element_size);
      ZVar2 = 0x100000;
    }
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZyanVectorSwapElements(ZyanVector* vector, ZyanUSize index_first, ZyanUSize index_second)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if ((index_first >= vector->size) || (index_second >= vector->size))
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (vector->size == vector->capacity)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    ZyanU64* const t = ZYCORE_VECTOR_OFFSET(vector, vector->size);
    ZyanU64* const a = ZYCORE_VECTOR_OFFSET(vector, index_first);
    ZyanU64* const b = ZYCORE_VECTOR_OFFSET(vector, index_second);
    ZYAN_MEMCPY(t, a, vector->element_size);
    ZYAN_MEMCPY(a, b, vector->element_size);
    ZYAN_MEMCPY(b, t, vector->element_size);

    return ZYAN_STATUS_SUCCESS;
}